

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::replace_illegal_names(CompilerGLSL *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  string *local_4790;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3033;
  key_equal local_3032;
  hasher local_3031;
  undefined1 local_3030;
  allocator local_302f;
  allocator local_302e;
  allocator local_302d;
  allocator local_302c;
  allocator local_302b;
  allocator local_302a;
  allocator local_3029;
  allocator local_3028;
  allocator local_3027;
  allocator local_3026;
  allocator local_3025;
  allocator local_3024;
  allocator local_3023;
  allocator local_3022;
  allocator local_3021;
  allocator local_3020;
  allocator local_301f;
  allocator local_301e;
  allocator local_301d;
  allocator local_301c;
  allocator local_301b;
  allocator local_301a;
  allocator local_3019;
  allocator local_3018;
  allocator local_3017;
  allocator local_3016;
  allocator local_3015;
  allocator local_3014;
  allocator local_3013;
  allocator local_3012;
  allocator local_3011;
  allocator local_3010;
  allocator local_300f;
  allocator local_300e;
  allocator local_300d;
  allocator local_300c;
  allocator local_300b;
  allocator local_300a;
  allocator local_3009;
  allocator local_3008;
  allocator local_3007;
  allocator local_3006;
  allocator local_3005;
  allocator local_3004;
  allocator local_3003;
  allocator local_3002;
  allocator local_3001;
  allocator local_3000;
  allocator local_2fff;
  allocator local_2ffe;
  allocator local_2ffd;
  allocator local_2ffc;
  allocator local_2ffb;
  allocator local_2ffa;
  allocator local_2ff9;
  allocator local_2ff8;
  allocator local_2ff7;
  allocator local_2ff6;
  allocator local_2ff5;
  allocator local_2ff4;
  allocator local_2ff3;
  allocator local_2ff2;
  allocator local_2ff1;
  allocator local_2ff0;
  allocator local_2fef;
  allocator local_2fee;
  allocator local_2fed;
  allocator local_2fec;
  allocator local_2feb;
  allocator local_2fea;
  allocator local_2fe9;
  allocator local_2fe8;
  allocator local_2fe7;
  allocator local_2fe6;
  allocator local_2fe5;
  allocator local_2fe4;
  allocator local_2fe3;
  allocator local_2fe2;
  allocator local_2fe1;
  allocator local_2fe0;
  allocator local_2fdf;
  allocator local_2fde;
  allocator local_2fdd;
  allocator local_2fdc;
  allocator local_2fdb;
  allocator local_2fda;
  allocator local_2fd9;
  allocator local_2fd8;
  allocator local_2fd7;
  allocator local_2fd6;
  allocator local_2fd5;
  allocator local_2fd4;
  allocator local_2fd3;
  allocator local_2fd2;
  allocator local_2fd1;
  allocator local_2fd0;
  allocator local_2fcf;
  allocator local_2fce;
  allocator local_2fcd;
  allocator local_2fcc;
  allocator local_2fcb;
  allocator local_2fca;
  allocator local_2fc9;
  allocator local_2fc8;
  allocator local_2fc7;
  allocator local_2fc6;
  allocator local_2fc5;
  allocator local_2fc4;
  allocator local_2fc3;
  allocator local_2fc2;
  allocator local_2fc1;
  allocator local_2fc0;
  allocator local_2fbf;
  allocator local_2fbe;
  allocator local_2fbd;
  allocator local_2fbc;
  allocator local_2fbb;
  allocator local_2fba;
  allocator local_2fb9;
  allocator local_2fb8;
  allocator local_2fb7;
  allocator local_2fb6;
  allocator local_2fb5;
  allocator local_2fb4;
  allocator local_2fb3;
  allocator local_2fb2;
  allocator local_2fb1;
  allocator local_2fb0;
  allocator local_2faf;
  allocator local_2fae;
  allocator local_2fad;
  allocator local_2fac;
  allocator local_2fab;
  allocator local_2faa;
  allocator local_2fa9;
  allocator local_2fa8;
  allocator local_2fa7;
  allocator local_2fa6;
  allocator local_2fa5;
  allocator local_2fa4;
  allocator local_2fa3;
  allocator local_2fa2;
  allocator local_2fa1;
  allocator local_2fa0;
  allocator local_2f9f;
  allocator local_2f9e;
  allocator local_2f9d;
  allocator local_2f9c;
  allocator local_2f9b;
  allocator local_2f9a;
  allocator local_2f99;
  allocator local_2f98;
  allocator local_2f97;
  allocator local_2f96;
  allocator local_2f95;
  allocator local_2f94;
  allocator local_2f93;
  allocator local_2f92;
  allocator local_2f91;
  allocator local_2f90;
  allocator local_2f8f;
  allocator local_2f8e;
  allocator local_2f8d;
  allocator local_2f8c;
  allocator local_2f8b;
  allocator local_2f8a;
  allocator local_2f89;
  allocator local_2f88;
  allocator local_2f87;
  allocator local_2f86;
  allocator local_2f85;
  allocator local_2f84;
  allocator local_2f83;
  allocator local_2f82;
  allocator local_2f81;
  allocator local_2f80;
  allocator local_2f7f;
  allocator local_2f7e;
  allocator local_2f7d;
  allocator local_2f7c;
  allocator local_2f7b;
  allocator local_2f7a;
  allocator local_2f79;
  allocator local_2f78;
  allocator local_2f77;
  allocator local_2f76;
  allocator local_2f75;
  allocator local_2f74;
  allocator local_2f73;
  allocator local_2f72;
  allocator local_2f71;
  allocator local_2f70;
  allocator local_2f6f;
  allocator local_2f6e;
  allocator local_2f6d;
  allocator local_2f6c;
  allocator local_2f6b;
  allocator local_2f6a;
  allocator local_2f69;
  allocator local_2f68;
  allocator local_2f67;
  allocator local_2f66;
  allocator local_2f65;
  allocator local_2f64;
  allocator local_2f63;
  allocator local_2f62;
  allocator local_2f61;
  allocator local_2f60;
  allocator local_2f5f;
  allocator local_2f5e;
  allocator local_2f5d;
  allocator local_2f5c;
  allocator local_2f5b;
  allocator local_2f5a;
  allocator local_2f59;
  allocator local_2f58;
  allocator local_2f57;
  allocator local_2f56;
  allocator local_2f55;
  allocator local_2f54;
  allocator local_2f53;
  allocator local_2f52;
  allocator local_2f51;
  allocator local_2f50;
  allocator local_2f4f;
  allocator local_2f4e;
  allocator local_2f4d;
  allocator local_2f4c;
  allocator local_2f4b;
  allocator local_2f4a;
  allocator local_2f49;
  allocator local_2f48;
  allocator local_2f47;
  allocator local_2f46;
  allocator local_2f45;
  allocator local_2f44;
  allocator local_2f43;
  allocator local_2f42;
  allocator local_2f41;
  allocator local_2f40;
  allocator local_2f3f;
  allocator local_2f3e;
  allocator local_2f3d;
  allocator local_2f3c;
  allocator local_2f3b;
  allocator local_2f3a;
  allocator local_2f39;
  allocator local_2f38;
  allocator local_2f37;
  allocator local_2f36;
  allocator local_2f35;
  allocator local_2f34;
  allocator local_2f33;
  allocator local_2f32;
  allocator local_2f31;
  allocator local_2f30;
  allocator local_2f2f;
  allocator local_2f2e;
  allocator local_2f2d;
  allocator local_2f2c;
  allocator local_2f2b;
  allocator local_2f2a;
  allocator local_2f29;
  allocator local_2f28;
  allocator local_2f27;
  allocator local_2f26;
  allocator local_2f25;
  allocator local_2f24;
  allocator local_2f23;
  allocator local_2f22;
  allocator local_2f21;
  allocator local_2f20;
  allocator local_2f1f;
  allocator local_2f1e;
  allocator local_2f1d;
  allocator local_2f1c;
  allocator local_2f1b;
  allocator local_2f1a;
  allocator local_2f19;
  allocator local_2f18;
  allocator local_2f17;
  allocator local_2f16;
  allocator local_2f15;
  allocator local_2f14;
  allocator local_2f13;
  allocator local_2f12;
  allocator local_2f11;
  allocator local_2f10;
  allocator local_2f0f;
  allocator local_2f0e;
  allocator local_2f0d;
  allocator local_2f0c;
  allocator local_2f0b;
  allocator local_2f0a;
  allocator local_2f09;
  allocator local_2f08;
  allocator local_2f07;
  allocator local_2f06;
  allocator local_2f05;
  allocator local_2f04;
  allocator local_2f03;
  allocator local_2f02;
  allocator local_2f01;
  allocator local_2f00;
  allocator local_2eff;
  allocator local_2efe;
  allocator local_2efd;
  allocator local_2efc;
  allocator local_2efb;
  allocator local_2efa;
  allocator local_2ef9;
  allocator local_2ef8;
  allocator local_2ef7;
  allocator local_2ef6;
  allocator local_2ef5;
  allocator local_2ef4;
  allocator local_2ef3;
  allocator local_2ef2;
  allocator local_2ef1;
  allocator local_2ef0;
  allocator local_2eef;
  allocator local_2eee;
  allocator local_2eed;
  allocator local_2eec;
  allocator local_2eeb;
  allocator local_2eea;
  allocator local_2ee9;
  allocator local_2ee8;
  allocator local_2ee7;
  allocator local_2ee6;
  allocator local_2ee5;
  allocator local_2ee4;
  allocator local_2ee3;
  allocator local_2ee2;
  allocator local_2ee1;
  allocator local_2ee0;
  allocator local_2edf;
  allocator local_2ede;
  allocator local_2edd;
  allocator local_2edc;
  allocator local_2edb;
  allocator local_2eda;
  allocator local_2ed9;
  allocator local_2ed8;
  allocator local_2ed7;
  allocator local_2ed6;
  allocator local_2ed5;
  allocator local_2ed4;
  allocator local_2ed3;
  allocator local_2ed2;
  allocator local_2ed1;
  allocator local_2ed0;
  allocator local_2ecf;
  allocator local_2ece;
  allocator local_2ecd;
  allocator local_2ecc;
  allocator local_2ecb;
  allocator local_2eca;
  allocator local_2ec9;
  allocator local_2ec8;
  allocator local_2ec7;
  allocator local_2ec6;
  allocator local_2ec5;
  allocator local_2ec4;
  allocator local_2ec3;
  allocator local_2ec2;
  allocator local_2ec1;
  allocator local_2ec0;
  allocator local_2ebf;
  allocator local_2ebe;
  allocator local_2ebd [20];
  allocator local_2ea9;
  string *local_2ea8;
  string local_2ea0 [32];
  string local_2e80 [32];
  string local_2e60 [32];
  string local_2e40 [32];
  string local_2e20 [32];
  string local_2e00 [32];
  string local_2de0 [32];
  string local_2dc0 [32];
  string local_2da0 [32];
  string local_2d80 [32];
  string local_2d60 [32];
  string local_2d40 [32];
  string local_2d20 [32];
  string local_2d00 [32];
  string local_2ce0 [32];
  string local_2cc0 [32];
  string local_2ca0 [32];
  string local_2c80 [32];
  string local_2c60 [32];
  string local_2c40 [32];
  string local_2c20 [32];
  string local_2c00 [32];
  string local_2be0 [32];
  string local_2bc0 [32];
  string local_2ba0 [32];
  string local_2b80 [32];
  string local_2b60 [32];
  string local_2b40 [32];
  string local_2b20 [32];
  string local_2b00 [32];
  string local_2ae0 [32];
  string local_2ac0 [32];
  string local_2aa0 [32];
  string local_2a80 [32];
  string local_2a60 [32];
  string local_2a40 [32];
  string local_2a20 [32];
  string local_2a00 [32];
  string local_29e0 [32];
  string local_29c0 [32];
  string local_29a0 [32];
  string local_2980 [32];
  string local_2960 [32];
  string local_2940 [32];
  string local_2920 [32];
  string local_2900 [32];
  string local_28e0 [32];
  string local_28c0 [32];
  string local_28a0 [32];
  string local_2880 [32];
  string local_2860 [32];
  string local_2840 [32];
  string local_2820 [32];
  string local_2800 [32];
  string local_27e0 [32];
  string local_27c0 [32];
  string local_27a0 [32];
  string local_2780 [32];
  string local_2760 [32];
  string local_2740 [32];
  string local_2720 [32];
  string local_2700 [32];
  string local_26e0 [32];
  string local_26c0 [32];
  string local_26a0 [32];
  string local_2680 [32];
  string local_2660 [32];
  string local_2640 [32];
  string local_2620 [32];
  string local_2600 [32];
  string local_25e0 [32];
  string local_25c0 [32];
  string local_25a0 [32];
  string local_2580 [32];
  string local_2560 [32];
  string local_2540 [32];
  string local_2520 [32];
  string local_2500 [32];
  string local_24e0 [32];
  string local_24c0 [32];
  string local_24a0 [32];
  string local_2480 [32];
  string local_2460 [32];
  string local_2440 [32];
  string local_2420 [32];
  string local_2400 [32];
  string local_23e0 [32];
  string local_23c0 [32];
  string local_23a0 [32];
  string local_2380 [32];
  string local_2360 [32];
  string local_2340 [32];
  string local_2320 [32];
  string local_2300 [32];
  string local_22e0 [32];
  string local_22c0 [32];
  string local_22a0 [32];
  string local_2280 [32];
  string local_2260 [32];
  string local_2240 [32];
  string local_2220 [32];
  string local_2200 [32];
  string local_21e0 [32];
  string local_21c0 [32];
  string local_21a0 [32];
  string local_2180 [32];
  string local_2160 [32];
  string local_2140 [32];
  string local_2120 [32];
  string local_2100 [32];
  string local_20e0 [32];
  string local_20c0 [32];
  string local_20a0 [32];
  string local_2080 [32];
  string local_2060 [32];
  string local_2040 [32];
  string local_2020 [32];
  string local_2000 [32];
  string local_1fe0 [32];
  string local_1fc0 [32];
  string local_1fa0 [32];
  string local_1f80 [32];
  string local_1f60 [32];
  string local_1f40 [32];
  string local_1f20 [32];
  string local_1f00 [32];
  string local_1ee0 [32];
  string local_1ec0 [32];
  string local_1ea0 [32];
  string local_1e80 [32];
  string local_1e60 [32];
  string local_1e40 [32];
  string local_1e20 [32];
  string local_1e00 [32];
  string local_1de0 [32];
  string local_1dc0 [32];
  string local_1da0 [32];
  string local_1d80 [32];
  string local_1d60 [32];
  string local_1d40 [32];
  string local_1d20 [32];
  string local_1d00 [32];
  string local_1ce0 [32];
  string local_1cc0 [32];
  string local_1ca0 [32];
  string local_1c80 [32];
  string local_1c60 [32];
  string local_1c40 [32];
  string local_1c20 [32];
  string local_1c00 [32];
  string local_1be0 [32];
  string local_1bc0 [32];
  string local_1ba0 [32];
  string local_1b80 [32];
  string local_1b60 [32];
  string local_1b40 [32];
  string local_1b20 [32];
  string local_1b00 [32];
  string local_1ae0 [32];
  string local_1ac0 [32];
  string local_1aa0 [32];
  string local_1a80 [32];
  string local_1a60 [32];
  string local_1a40 [32];
  string local_1a20 [32];
  string local_1a00 [32];
  string local_19e0 [32];
  string local_19c0 [32];
  string local_19a0 [32];
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660 [32];
  string local_1640 [32];
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  string local_1560 [32];
  string local_1540 [32];
  string local_1520 [32];
  string local_1500 [32];
  string local_14e0 [32];
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  string local_1220 [32];
  string local_1200 [32];
  string local_11e0 [32];
  string local_11c0 [32];
  string local_11a0 [32];
  string local_1180 [32];
  string local_1160 [32];
  string local_1140 [32];
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  CompilerGLSL *local_10;
  CompilerGLSL *this_local;
  
  local_10 = this;
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_3030 = 1;
      local_2ea8 = local_2ea0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2ea0,"abs",&local_2ea9);
      local_2ea8 = local_2e80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e80,"acos",local_2ebd);
      local_2ea8 = local_2e60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e60,"acosh",&local_2ebe);
      local_2ea8 = local_2e40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e40,"all",&local_2ebf);
      local_2ea8 = local_2e20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e20,"any",&local_2ec0);
      local_2ea8 = local_2e00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e00,"asin",&local_2ec1);
      local_2ea8 = local_2de0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2de0,"asinh",&local_2ec2);
      local_2ea8 = local_2dc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2dc0,"atan",&local_2ec3);
      local_2ea8 = local_2da0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2da0,"atanh",&local_2ec4);
      local_2ea8 = local_2d80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d80,"atomicAdd",&local_2ec5);
      local_2ea8 = local_2d60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d60,"atomicCompSwap",&local_2ec6);
      local_2ea8 = local_2d40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d40,"atomicCounter",&local_2ec7);
      local_2ea8 = local_2d20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d20,"atomicCounterDecrement",&local_2ec8);
      local_2ea8 = local_2d00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d00,"atomicCounterIncrement",&local_2ec9);
      local_2ea8 = local_2ce0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2ce0,"atomicExchange",&local_2eca);
      local_2ea8 = local_2cc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2cc0,"atomicMax",&local_2ecb);
      local_2ea8 = local_2ca0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2ca0,"atomicMin",&local_2ecc);
      local_2ea8 = local_2c80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c80,"atomicOr",&local_2ecd);
      local_2ea8 = local_2c60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c60,"atomicXor",&local_2ece);
      local_2ea8 = local_2c40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c40,"bitCount",&local_2ecf);
      local_2ea8 = local_2c20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c20,"bitfieldExtract",&local_2ed0);
      local_2ea8 = local_2c00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c00,"bitfieldInsert",&local_2ed1);
      local_2ea8 = local_2be0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2be0,"bitfieldReverse",&local_2ed2);
      local_2ea8 = local_2bc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2bc0,"ceil",&local_2ed3);
      local_2ea8 = local_2ba0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2ba0,"cos",&local_2ed4);
      local_2ea8 = local_2b80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b80,"cosh",&local_2ed5);
      local_2ea8 = local_2b60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b60,"cross",&local_2ed6);
      local_2ea8 = local_2b40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b40,"degrees",&local_2ed7);
      local_2ea8 = local_2b20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b20,"dFdx",&local_2ed8);
      local_2ea8 = local_2b00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b00,"dFdxCoarse",&local_2ed9);
      local_2ea8 = local_2ae0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2ae0,"dFdxFine",&local_2eda);
      local_2ea8 = local_2ac0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2ac0,"dFdy",&local_2edb);
      local_2ea8 = local_2aa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2aa0,"dFdyCoarse",&local_2edc);
      local_2ea8 = local_2a80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a80,"dFdyFine",&local_2edd);
      local_2ea8 = local_2a60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a60,"distance",&local_2ede);
      local_2ea8 = local_2a40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a40,"dot",&local_2edf);
      local_2ea8 = local_2a20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a20,"EmitStreamVertex",&local_2ee0);
      local_2ea8 = local_2a00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a00,"EmitVertex",&local_2ee1);
      local_2ea8 = local_29e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_29e0,"EndPrimitive",&local_2ee2);
      local_2ea8 = local_29c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_29c0,"EndStreamPrimitive",&local_2ee3);
      local_2ea8 = local_29a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_29a0,"equal",&local_2ee4);
      local_2ea8 = local_2980;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2980,"exp",&local_2ee5);
      local_2ea8 = local_2960;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2960,"exp2",&local_2ee6);
      local_2ea8 = local_2940;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2940,"faceforward",&local_2ee7);
      local_2ea8 = local_2920;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2920,"findLSB",&local_2ee8);
      local_2ea8 = local_2900;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2900,"findMSB",&local_2ee9);
      local_2ea8 = local_28e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_28e0,"float16BitsToInt16",&local_2eea);
      local_2ea8 = local_28c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_28c0,"float16BitsToUint16",&local_2eeb);
      local_2ea8 = local_28a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_28a0,"floatBitsToInt",&local_2eec);
      local_2ea8 = local_2880;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2880,"floatBitsToUint",&local_2eed);
      local_2ea8 = local_2860;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2860,"floor",&local_2eee);
      local_2ea8 = local_2840;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2840,"fma",&local_2eef);
      local_2ea8 = local_2820;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2820,"fract",&local_2ef0);
      local_2ea8 = local_2800;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2800,"frexp",&local_2ef1);
      local_2ea8 = local_27e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_27e0,"fwidth",&local_2ef2);
      local_2ea8 = local_27c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_27c0,"fwidthCoarse",&local_2ef3);
      local_2ea8 = local_27a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_27a0,"fwidthFine",&local_2ef4);
      local_2ea8 = local_2780;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2780,"greaterThan",&local_2ef5);
      local_2ea8 = local_2760;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2760,"greaterThanEqual",&local_2ef6);
      local_2ea8 = local_2740;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2740,"groupMemoryBarrier",&local_2ef7);
      local_2ea8 = local_2720;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2720,"imageAtomicAdd",&local_2ef8);
      local_2ea8 = local_2700;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2700,"imageAtomicAnd",&local_2ef9);
      local_2ea8 = local_26e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_26e0,"imageAtomicCompSwap",&local_2efa);
      local_2ea8 = local_26c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_26c0,"imageAtomicExchange",&local_2efb);
      local_2ea8 = local_26a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_26a0,"imageAtomicMax",&local_2efc);
      local_2ea8 = local_2680;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2680,"imageAtomicMin",&local_2efd);
      local_2ea8 = local_2660;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2660,"imageAtomicOr",&local_2efe);
      local_2ea8 = local_2640;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2640,"imageAtomicXor",&local_2eff);
      local_2ea8 = local_2620;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2620,"imageLoad",&local_2f00);
      local_2ea8 = local_2600;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2600,"imageSamples",&local_2f01);
      local_2ea8 = local_25e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_25e0,"imageSize",&local_2f02);
      local_2ea8 = local_25c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_25c0,"imageStore",&local_2f03);
      local_2ea8 = local_25a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_25a0,"imulExtended",&local_2f04);
      local_2ea8 = local_2580;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2580,"int16BitsToFloat16",&local_2f05);
      local_2ea8 = local_2560;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2560,"intBitsToFloat",&local_2f06);
      local_2ea8 = local_2540;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2540,"interpolateAtOffset",&local_2f07);
      local_2ea8 = local_2520;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2520,"interpolateAtCentroid",&local_2f08);
      local_2ea8 = local_2500;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2500,"interpolateAtSample",&local_2f09);
      local_2ea8 = local_24e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_24e0,"inverse",&local_2f0a);
      local_2ea8 = local_24c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_24c0,"inversesqrt",&local_2f0b);
      local_2ea8 = local_24a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_24a0,"isinf",&local_2f0c);
      local_2ea8 = local_2480;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2480,"isnan",&local_2f0d);
      local_2ea8 = local_2460;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2460,"ldexp",&local_2f0e);
      local_2ea8 = local_2440;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2440,"length",&local_2f0f);
      local_2ea8 = local_2420;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2420,"lessThan",&local_2f10);
      local_2ea8 = local_2400;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2400,"lessThanEqual",&local_2f11);
      local_2ea8 = local_23e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_23e0,"log",&local_2f12);
      local_2ea8 = local_23c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_23c0,"log2",&local_2f13);
      local_2ea8 = local_23a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_23a0,"matrixCompMult",&local_2f14);
      local_2ea8 = local_2380;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2380,"max",&local_2f15);
      local_2ea8 = local_2360;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2360,"memoryBarrier",&local_2f16);
      local_2ea8 = local_2340;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2340,"memoryBarrierAtomicCounter",&local_2f17);
      local_2ea8 = local_2320;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2320,"memoryBarrierBuffer",&local_2f18);
      local_2ea8 = local_2300;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2300,"memoryBarrierImage",&local_2f19);
      local_2ea8 = local_22e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_22e0,"memoryBarrierShared",&local_2f1a);
      local_2ea8 = local_22c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_22c0,"min",&local_2f1b);
      local_2ea8 = local_22a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_22a0,"mix",&local_2f1c);
      local_2ea8 = local_2280;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2280,"mod",&local_2f1d);
      local_2ea8 = local_2260;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2260,"modf",&local_2f1e);
      local_2ea8 = local_2240;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2240,"noise",&local_2f1f);
      local_2ea8 = local_2220;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2220,"noise1",&local_2f20);
      local_2ea8 = local_2200;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2200,"noise2",&local_2f21);
      local_2ea8 = local_21e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_21e0,"noise3",&local_2f22);
      local_2ea8 = local_21c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_21c0,"noise4",&local_2f23);
      local_2ea8 = local_21a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_21a0,"normalize",&local_2f24);
      local_2ea8 = local_2180;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2180,"not",&local_2f25);
      local_2ea8 = local_2160;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2160,"notEqual",&local_2f26);
      local_2ea8 = local_2140;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2140,"outerProduct",&local_2f27);
      local_2ea8 = local_2120;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2120,"packDouble2x32",&local_2f28);
      local_2ea8 = local_2100;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2100,"packHalf2x16",&local_2f29);
      local_2ea8 = local_20e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_20e0,"packInt2x16",&local_2f2a);
      local_2ea8 = local_20c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_20c0,"packInt4x16",&local_2f2b);
      local_2ea8 = local_20a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_20a0,"packSnorm2x16",&local_2f2c);
      local_2ea8 = local_2080;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2080,"packSnorm4x8",&local_2f2d);
      local_2ea8 = local_2060;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2060,"packUint2x16",&local_2f2e);
      local_2ea8 = local_2040;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2040,"packUint4x16",&local_2f2f);
      local_2ea8 = local_2020;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2020,"packUnorm2x16",&local_2f30);
      local_2ea8 = local_2000;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2000,"packUnorm4x8",&local_2f31);
      local_2ea8 = local_1fe0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1fe0,"pow",&local_2f32);
      local_2ea8 = local_1fc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1fc0,"radians",&local_2f33);
      local_2ea8 = local_1fa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1fa0,"reflect",&local_2f34);
      local_2ea8 = local_1f80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f80,"refract",&local_2f35);
      local_2ea8 = local_1f60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f60,"round",&local_2f36);
      local_2ea8 = local_1f40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f40,"roundEven",&local_2f37);
      local_2ea8 = local_1f20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f20,"sign",&local_2f38);
      local_2ea8 = local_1f00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f00,"sin",&local_2f39);
      local_2ea8 = local_1ee0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ee0,"sinh",&local_2f3a);
      local_2ea8 = local_1ec0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ec0,"smoothstep",&local_2f3b);
      local_2ea8 = local_1ea0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ea0,"sqrt",&local_2f3c);
      local_2ea8 = local_1e80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e80,"step",&local_2f3d);
      local_2ea8 = local_1e60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e60,"tan",&local_2f3e);
      local_2ea8 = local_1e40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e40,"tanh",&local_2f3f);
      local_2ea8 = local_1e20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e20,"texelFetch",&local_2f40);
      local_2ea8 = local_1e00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e00,"texelFetchOffset",&local_2f41);
      local_2ea8 = local_1de0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1de0,"texture",&local_2f42);
      local_2ea8 = local_1dc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1dc0,"textureGather",&local_2f43);
      local_2ea8 = local_1da0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1da0,"textureGatherOffset",&local_2f44);
      local_2ea8 = local_1d80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d80,"textureGatherOffsets",&local_2f45);
      local_2ea8 = local_1d60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d60,"textureGrad",&local_2f46);
      local_2ea8 = local_1d40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d40,"textureGradOffset",&local_2f47);
      local_2ea8 = local_1d20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d20,"textureLod",&local_2f48);
      local_2ea8 = local_1d00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d00,"textureLodOffset",&local_2f49);
      local_2ea8 = local_1ce0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ce0,"textureOffset",&local_2f4a);
      local_2ea8 = local_1cc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1cc0,"textureProj",&local_2f4b);
      local_2ea8 = local_1ca0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ca0,"textureProjGrad",&local_2f4c);
      local_2ea8 = local_1c80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c80,"textureProjGradOffset",&local_2f4d);
      local_2ea8 = local_1c60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c60,"textureProjLod",&local_2f4e);
      local_2ea8 = local_1c40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c40,"textureProjLodOffset",&local_2f4f);
      local_2ea8 = local_1c20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c20,"textureProjOffset",&local_2f50);
      local_2ea8 = local_1c00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c00,"textureQueryLevels",&local_2f51);
      local_2ea8 = local_1be0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1be0,"textureQueryLod",&local_2f52);
      local_2ea8 = local_1bc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1bc0,"textureSamples",&local_2f53);
      local_2ea8 = local_1ba0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ba0,"textureSize",&local_2f54);
      local_2ea8 = local_1b80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b80,"transpose",&local_2f55);
      local_2ea8 = local_1b60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b60,"trunc",&local_2f56);
      local_2ea8 = local_1b40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b40,"uaddCarry",&local_2f57);
      local_2ea8 = local_1b20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b20,"uint16BitsToFloat16",&local_2f58);
      local_2ea8 = local_1b00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b00,"uintBitsToFloat",&local_2f59);
      local_2ea8 = local_1ae0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ae0,"umulExtended",&local_2f5a);
      local_2ea8 = local_1ac0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1ac0,"unpackDouble2x32",&local_2f5b);
      local_2ea8 = local_1aa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1aa0,"unpackHalf2x16",&local_2f5c);
      local_2ea8 = local_1a80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a80,"unpackInt2x16",&local_2f5d);
      local_2ea8 = local_1a60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a60,"unpackInt4x16",&local_2f5e);
      local_2ea8 = local_1a40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a40,"unpackSnorm2x16",&local_2f5f);
      local_2ea8 = local_1a20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a20,"unpackSnorm4x8",&local_2f60);
      local_2ea8 = local_1a00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a00,"unpackUint2x16",&local_2f61);
      local_2ea8 = local_19e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_19e0,"unpackUint4x16",&local_2f62);
      local_2ea8 = local_19c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_19c0,"unpackUnorm2x16",&local_2f63);
      local_2ea8 = local_19a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_19a0,"unpackUnorm4x8",&local_2f64);
      local_2ea8 = local_1980;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1980,"usubBorrow",&local_2f65);
      local_2ea8 = local_1960;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1960,"active",&local_2f66);
      local_2ea8 = local_1940;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1940,"asm",&local_2f67);
      local_2ea8 = local_1920;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1920,"atomic_uint",&local_2f68);
      local_2ea8 = local_1900;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1900,"attribute",&local_2f69);
      local_2ea8 = local_18e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_18e0,"bool",&local_2f6a);
      local_2ea8 = local_18c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_18c0,"break",&local_2f6b);
      local_2ea8 = local_18a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_18a0,"buffer",&local_2f6c);
      local_2ea8 = local_1880;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1880,"bvec2",&local_2f6d);
      local_2ea8 = local_1860;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1860,"bvec3",&local_2f6e);
      local_2ea8 = local_1840;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1840,"bvec4",&local_2f6f);
      local_2ea8 = local_1820;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1820,"case",&local_2f70);
      local_2ea8 = local_1800;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1800,"cast",&local_2f71);
      local_2ea8 = local_17e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_17e0,"centroid",&local_2f72);
      local_2ea8 = local_17c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_17c0,"class",&local_2f73);
      local_2ea8 = local_17a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_17a0,"coherent",&local_2f74);
      local_2ea8 = local_1780;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1780,"common",&local_2f75);
      local_2ea8 = local_1760;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1760,"const",&local_2f76);
      local_2ea8 = local_1740;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1740,"continue",&local_2f77);
      local_2ea8 = local_1720;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1720,"default",&local_2f78);
      local_2ea8 = local_1700;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1700,"discard",&local_2f79);
      local_2ea8 = local_16e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_16e0,"dmat2",&local_2f7a);
      local_2ea8 = local_16c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_16c0,"dmat2x2",&local_2f7b);
      local_2ea8 = local_16a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_16a0,"dmat2x3",&local_2f7c);
      local_2ea8 = local_1680;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1680,"dmat2x4",&local_2f7d);
      local_2ea8 = local_1660;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1660,"dmat3",&local_2f7e);
      local_2ea8 = local_1640;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1640,"dmat3x2",&local_2f7f);
      local_2ea8 = local_1620;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1620,"dmat3x3",&local_2f80);
      local_2ea8 = local_1600;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1600,"dmat3x4",&local_2f81);
      local_2ea8 = local_15e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_15e0,"dmat4",&local_2f82);
      local_2ea8 = local_15c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_15c0,"dmat4x2",&local_2f83);
      local_2ea8 = local_15a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_15a0,"dmat4x3",&local_2f84);
      local_2ea8 = local_1580;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1580,"dmat4x4",&local_2f85);
      local_2ea8 = local_1560;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1560,"do",&local_2f86);
      local_2ea8 = local_1540;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1540,"double",&local_2f87);
      local_2ea8 = local_1520;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1520,"dvec2",&local_2f88);
      local_2ea8 = local_1500;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1500,"dvec3",&local_2f89);
      local_2ea8 = local_14e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_14e0,"dvec4",&local_2f8a);
      local_2ea8 = local_14c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_14c0,"else",&local_2f8b);
      local_2ea8 = local_14a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_14a0,"enum",&local_2f8c);
      local_2ea8 = local_1480;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1480,"extern",&local_2f8d);
      local_2ea8 = local_1460;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1460,"external",&local_2f8e);
      local_2ea8 = local_1440;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1440,"false",&local_2f8f);
      local_2ea8 = local_1420;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1420,"filter",&local_2f90);
      local_2ea8 = local_1400;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1400,"fixed",&local_2f91);
      local_2ea8 = local_13e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_13e0,"flat",&local_2f92);
      local_2ea8 = local_13c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_13c0,"float",&local_2f93);
      local_2ea8 = local_13a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_13a0,"for",&local_2f94);
      local_2ea8 = local_1380;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1380,"fvec2",&local_2f95);
      local_2ea8 = local_1360;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1360,"fvec3",&local_2f96);
      local_2ea8 = local_1340;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1340,"fvec4",&local_2f97);
      local_2ea8 = local_1320;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1320,"goto",&local_2f98);
      local_2ea8 = local_1300;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1300,"half",&local_2f99);
      local_2ea8 = local_12e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_12e0,"highp",&local_2f9a);
      local_2ea8 = local_12c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_12c0,"hvec2",&local_2f9b);
      local_2ea8 = local_12a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_12a0,"hvec3",&local_2f9c);
      local_2ea8 = local_1280;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1280,"hvec4",&local_2f9d);
      local_2ea8 = local_1260;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1260,"if",&local_2f9e);
      local_2ea8 = local_1240;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1240,"iimage1D",&local_2f9f);
      local_2ea8 = local_1220;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1220,"iimage1DArray",&local_2fa0);
      local_2ea8 = local_1200;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1200,"iimage2D",&local_2fa1);
      local_2ea8 = local_11e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_11e0,"iimage2DArray",&local_2fa2);
      local_2ea8 = local_11c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_11c0,"iimage2DMS",&local_2fa3);
      local_2ea8 = local_11a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_11a0,"iimage2DMSArray",&local_2fa4);
      local_2ea8 = local_1180;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1180,"iimage2DRect",&local_2fa5);
      local_2ea8 = local_1160;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1160,"iimage3D",&local_2fa6);
      local_2ea8 = local_1140;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1140,"iimageBuffer",&local_2fa7);
      local_2ea8 = local_1120;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1120,"iimageCube",&local_2fa8);
      local_2ea8 = local_1100;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1100,"iimageCubeArray",&local_2fa9);
      local_2ea8 = local_10e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_10e0,"image1D",&local_2faa);
      local_2ea8 = local_10c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_10c0,"image1DArray",&local_2fab);
      local_2ea8 = local_10a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_10a0,"image2D",&local_2fac);
      local_2ea8 = local_1080;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1080,"image2DArray",&local_2fad);
      local_2ea8 = local_1060;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1060,"image2DMS",&local_2fae);
      local_2ea8 = local_1040;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1040,"image2DMSArray",&local_2faf);
      local_2ea8 = local_1020;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1020,"image2DRect",&local_2fb0);
      local_2ea8 = local_1000;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1000,"image3D",&local_2fb1);
      local_2ea8 = local_fe0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fe0,"imageBuffer",&local_2fb2);
      local_2ea8 = local_fc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fc0,"imageCube",&local_2fb3);
      local_2ea8 = local_fa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fa0,"imageCubeArray",&local_2fb4);
      local_2ea8 = local_f80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f80,"in",&local_2fb5);
      local_2ea8 = local_f60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f60,"inline",&local_2fb6);
      local_2ea8 = local_f40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f40,"inout",&local_2fb7);
      local_2ea8 = local_f20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f20,"input",&local_2fb8);
      local_2ea8 = local_f00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f00,"int",&local_2fb9);
      local_2ea8 = local_ee0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ee0,"interface",&local_2fba);
      local_2ea8 = local_ec0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ec0,"invariant",&local_2fbb);
      local_2ea8 = local_ea0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ea0,"isampler1D",&local_2fbc);
      local_2ea8 = local_e80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e80,"isampler1DArray",&local_2fbd);
      local_2ea8 = local_e60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e60,"isampler2D",&local_2fbe);
      local_2ea8 = local_e40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e40,"isampler2DArray",&local_2fbf);
      local_2ea8 = local_e20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e20,"isampler2DMS",&local_2fc0);
      local_2ea8 = local_e00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e00,"isampler2DMSArray",&local_2fc1);
      local_2ea8 = local_de0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_de0,"isampler2DRect",&local_2fc2);
      local_2ea8 = local_dc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_dc0,"isampler3D",&local_2fc3);
      local_2ea8 = local_da0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_da0,"isamplerBuffer",&local_2fc4);
      local_2ea8 = local_d80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d80,"isamplerCube",&local_2fc5);
      local_2ea8 = local_d60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d60,"isamplerCubeArray",&local_2fc6);
      local_2ea8 = local_d40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d40,"ivec2",&local_2fc7);
      local_2ea8 = local_d20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d20,"ivec3",&local_2fc8);
      local_2ea8 = local_d00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d00,"ivec4",&local_2fc9);
      local_2ea8 = local_ce0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ce0,"layout",&local_2fca);
      local_2ea8 = local_cc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cc0,"long",&local_2fcb);
      local_2ea8 = local_ca0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ca0,"lowp",&local_2fcc);
      local_2ea8 = local_c80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c80,"mat2",&local_2fcd);
      local_2ea8 = local_c60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c60,"mat2x2",&local_2fce);
      local_2ea8 = local_c40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c40,"mat2x3",&local_2fcf);
      local_2ea8 = local_c20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c20,"mat2x4",&local_2fd0);
      local_2ea8 = local_c00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c00,"mat3",&local_2fd1);
      local_2ea8 = local_be0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_be0,"mat3x2",&local_2fd2);
      local_2ea8 = local_bc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bc0,"mat3x3",&local_2fd3);
      local_2ea8 = local_ba0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ba0,"mat3x4",&local_2fd4);
      local_2ea8 = local_b80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b80,"mat4",&local_2fd5);
      local_2ea8 = local_b60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b60,"mat4x2",&local_2fd6);
      local_2ea8 = local_b40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b40,"mat4x3",&local_2fd7);
      local_2ea8 = local_b20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b20,"mat4x4",&local_2fd8);
      local_2ea8 = local_b00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b00,"mediump",&local_2fd9);
      local_2ea8 = local_ae0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ae0,"namespace",&local_2fda);
      local_2ea8 = local_ac0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ac0,"noinline",&local_2fdb);
      local_2ea8 = local_aa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_aa0,"noperspective",&local_2fdc);
      local_2ea8 = local_a80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a80,"out",&local_2fdd);
      local_2ea8 = local_a60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a60,"output",&local_2fde);
      local_2ea8 = local_a40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a40,"packed",&local_2fdf);
      local_2ea8 = local_a20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a20,"partition",&local_2fe0);
      local_2ea8 = local_a00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a00,"patch",&local_2fe1);
      local_2ea8 = local_9e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9e0,"precise",&local_2fe2);
      local_2ea8 = local_9c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9c0,"precision",&local_2fe3);
      local_2ea8 = local_9a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9a0,"public",&local_2fe4);
      local_2ea8 = local_980;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_980,"readonly",&local_2fe5);
      local_2ea8 = local_960;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_960,"resource",&local_2fe6);
      local_2ea8 = local_940;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_940,"restrict",&local_2fe7);
      local_2ea8 = local_920;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_920,"return",&local_2fe8);
      local_2ea8 = local_900;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_900,"sample",&local_2fe9);
      local_2ea8 = local_8e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8e0,"sampler1D",&local_2fea);
      local_2ea8 = local_8c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8c0,"sampler1DArray",&local_2feb);
      local_2ea8 = local_8a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8a0,"sampler1DArrayShadow",&local_2fec);
      local_2ea8 = local_880;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_880,"sampler1DShadow",&local_2fed);
      local_2ea8 = local_860;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_860,"sampler2D",&local_2fee);
      local_2ea8 = local_840;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_840,"sampler2DArray",&local_2fef);
      local_2ea8 = local_820;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_820,"sampler2DArrayShadow",&local_2ff0);
      local_2ea8 = local_800;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_800,"sampler2DMS",&local_2ff1);
      local_2ea8 = local_7e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7e0,"sampler2DMSArray",&local_2ff2);
      local_2ea8 = local_7c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7c0,"sampler2DRect",&local_2ff3);
      local_2ea8 = local_7a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7a0,"sampler2DRectShadow",&local_2ff4);
      local_2ea8 = local_780;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_780,"sampler2DShadow",&local_2ff5);
      local_2ea8 = local_760;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_760,"sampler3D",&local_2ff6);
      local_2ea8 = local_740;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_740,"sampler3DRect",&local_2ff7);
      local_2ea8 = local_720;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_720,"samplerBuffer",&local_2ff8);
      local_2ea8 = local_700;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_700,"samplerCube",&local_2ff9);
      local_2ea8 = local_6e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6e0,"samplerCubeArray",&local_2ffa);
      local_2ea8 = local_6c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6c0,"samplerCubeArrayShadow",&local_2ffb);
      local_2ea8 = local_6a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6a0,"samplerCubeShadow",&local_2ffc);
      local_2ea8 = local_680;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_680,"shared",&local_2ffd);
      local_2ea8 = local_660;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_660,"short",&local_2ffe);
      local_2ea8 = local_640;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_640,"sizeof",&local_2fff);
      local_2ea8 = local_620;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_620,"smooth",&local_3000);
      local_2ea8 = local_600;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_600,"static",&local_3001);
      local_2ea8 = local_5e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5e0,"struct",&local_3002);
      local_2ea8 = local_5c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5c0,"subroutine",&local_3003);
      local_2ea8 = local_5a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5a0,"superp",&local_3004);
      local_2ea8 = local_580;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_580,"switch",&local_3005);
      local_2ea8 = local_560;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_560,"template",&local_3006);
      local_2ea8 = local_540;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_540,"this",&local_3007);
      local_2ea8 = local_520;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_520,"true",&local_3008);
      local_2ea8 = local_500;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_500,"typedef",&local_3009);
      local_2ea8 = local_4e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4e0,"uimage1D",&local_300a);
      local_2ea8 = local_4c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4c0,"uimage1DArray",&local_300b);
      local_2ea8 = local_4a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4a0,"uimage2D",&local_300c);
      local_2ea8 = local_480;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_480,"uimage2DArray",&local_300d);
      local_2ea8 = local_460;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_460,"uimage2DMS",&local_300e);
      local_2ea8 = local_440;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_440,"uimage2DMSArray",&local_300f);
      local_2ea8 = local_420;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_420,"uimage2DRect",&local_3010);
      local_2ea8 = local_400;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_400,"uimage3D",&local_3011);
      local_2ea8 = local_3e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3e0,"uimageBuffer",&local_3012);
      local_2ea8 = local_3c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3c0,"uimageCube",&local_3013);
      local_2ea8 = local_3a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3a0,"uimageCubeArray",&local_3014);
      local_2ea8 = local_380;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_380,"uint",&local_3015);
      local_2ea8 = local_360;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_360,"uniform",&local_3016);
      local_2ea8 = local_340;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_340,"union",&local_3017);
      local_2ea8 = local_320;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_320,"unsigned",&local_3018);
      local_2ea8 = local_300;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_300,"usampler1D",&local_3019);
      local_2ea8 = local_2e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e0,"usampler1DArray",&local_301a);
      local_2ea8 = local_2c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c0,"usampler2D",&local_301b);
      local_2ea8 = local_2a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a0,"usampler2DArray",&local_301c);
      local_2ea8 = local_280;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_280,"usampler2DMS",&local_301d);
      local_2ea8 = local_260;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_260,"usampler2DMSArray",&local_301e);
      local_2ea8 = local_240;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_240,"usampler2DRect",&local_301f);
      local_2ea8 = local_220;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_220,"usampler3D",&local_3020);
      local_2ea8 = local_200;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_200,"usamplerBuffer",&local_3021);
      local_2ea8 = local_1e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e0,"usamplerCube",&local_3022);
      local_2ea8 = local_1c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c0,"usamplerCubeArray",&local_3023);
      local_2ea8 = local_1a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a0,"using",&local_3024);
      local_2ea8 = local_180;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_180,"uvec2",&local_3025);
      local_2ea8 = local_160;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_160,"uvec3",&local_3026);
      local_2ea8 = local_140;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_140,"uvec4",&local_3027);
      local_2ea8 = local_120;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_120,"varying",&local_3028);
      local_2ea8 = local_100;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_100,"vec2",&local_3029);
      local_2ea8 = local_e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e0,"vec3",&local_302a);
      local_2ea8 = local_c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"vec4",&local_302b);
      local_2ea8 = local_a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"void",&local_302c);
      local_2ea8 = local_80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"volatile",&local_302d);
      local_2ea8 = local_60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"while",&local_302e);
      local_2ea8 = local_40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"writeonly",&local_302f);
      local_3030 = 0;
      local_20 = (iterator)local_2ea0;
      local_18 = 0x174;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_3033);
      __l._M_len = local_18;
      __l._M_array = local_20;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&replace_illegal_names()::keywords_abi_cxx11_,__l,0,&local_3031,&local_3032,
                      &local_3033);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_3033);
      local_4790 = (string *)&local_20;
      do {
        local_4790 = local_4790 + -0x20;
        ::std::__cxx11::string::~string(local_4790);
      } while (local_4790 != local_2ea0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_302f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_302e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_302d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_302c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_302b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_302a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3029);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3028);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3027);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3026);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3025);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3024);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3023);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3022);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3021);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3020);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_301f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_301e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_301d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_301c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_301b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_301a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3019);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3018);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3017);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3016);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3015);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3014);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3013);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3012);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3011);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3010);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_300f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_300e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_300d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_300c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_300b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_300a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3009);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3008);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3007);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3006);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3005);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3004);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3003);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3002);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3001);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3000);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fff);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ffe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ffd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ffc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ffb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ffa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ff0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fef);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fee);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fed);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fec);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2feb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fea);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fe0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fdf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fde);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fdd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fdc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fdb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fda);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fd0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fcf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fce);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fcd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fcc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fcb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fca);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fbf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fbe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fbd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fbc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fbb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fba);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fb0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2faf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fae);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fad);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fac);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2faa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2fa0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f99);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f98);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f97);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f96);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f95);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f94);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f93);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f92);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f91);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f90);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f8a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f89);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f88);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f87);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f86);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f85);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f84);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f83);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f82);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f81);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f80);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f7a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f79);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f77);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f76);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f75);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f74);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f73);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f72);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f71);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f6a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f69);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f67);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f66);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f65);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f64);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f63);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f62);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f61);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f60);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f5a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f59);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f57);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f56);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f55);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f54);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f53);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f52);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f51);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f50);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f4a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f49);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f47);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f46);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f45);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f44);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f43);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f42);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f41);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f3a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f39);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f38);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f37);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f36);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f35);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f34);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f33);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f32);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f31);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f30);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f2a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f29);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f28);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f27);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f26);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f25);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f24);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f23);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f22);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f21);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f20);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f19);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f18);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f17);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f16);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f15);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f14);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f13);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f12);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f11);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f10);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f0a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f09);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f08);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f07);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f06);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f05);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f04);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f03);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f02);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f01);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f00);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eff);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2efe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2efd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2efc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2efb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2efa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ef0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eef);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eee);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eed);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eec);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eeb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eea);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ee0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2edf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ede);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2edd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2edc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2edb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eda);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ed0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ecf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ece);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ecd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ecc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ecb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2eca);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ec0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ebf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ebe);
      ::std::allocator<char>::~allocator((allocator<char> *)local_2ebd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2ea9);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  replace_illegal_names(this,&replace_illegal_names()::keywords_abi_cxx11_);
  return;
}

Assistant:

void CompilerGLSL::replace_illegal_names()
{
	// clang-format off
	static const unordered_set<string> keywords = {
		"abs", "acos", "acosh", "all", "any", "asin", "asinh", "atan", "atanh",
		"atomicAdd", "atomicCompSwap", "atomicCounter", "atomicCounterDecrement", "atomicCounterIncrement",
		"atomicExchange", "atomicMax", "atomicMin", "atomicOr", "atomicXor",
		"bitCount", "bitfieldExtract", "bitfieldInsert", "bitfieldReverse",
		"ceil", "cos", "cosh", "cross", "degrees",
		"dFdx", "dFdxCoarse", "dFdxFine",
		"dFdy", "dFdyCoarse", "dFdyFine",
		"distance", "dot", "EmitStreamVertex", "EmitVertex", "EndPrimitive", "EndStreamPrimitive", "equal", "exp", "exp2",
		"faceforward", "findLSB", "findMSB", "float16BitsToInt16", "float16BitsToUint16", "floatBitsToInt", "floatBitsToUint", "floor", "fma", "fract",
		"frexp", "fwidth", "fwidthCoarse", "fwidthFine",
		"greaterThan", "greaterThanEqual", "groupMemoryBarrier",
		"imageAtomicAdd", "imageAtomicAnd", "imageAtomicCompSwap", "imageAtomicExchange", "imageAtomicMax", "imageAtomicMin", "imageAtomicOr", "imageAtomicXor",
		"imageLoad", "imageSamples", "imageSize", "imageStore", "imulExtended", "int16BitsToFloat16", "intBitsToFloat", "interpolateAtOffset", "interpolateAtCentroid", "interpolateAtSample",
		"inverse", "inversesqrt", "isinf", "isnan", "ldexp", "length", "lessThan", "lessThanEqual", "log", "log2",
		"matrixCompMult", "max", "memoryBarrier", "memoryBarrierAtomicCounter", "memoryBarrierBuffer", "memoryBarrierImage", "memoryBarrierShared",
		"min", "mix", "mod", "modf", "noise", "noise1", "noise2", "noise3", "noise4", "normalize", "not", "notEqual",
		"outerProduct", "packDouble2x32", "packHalf2x16", "packInt2x16", "packInt4x16", "packSnorm2x16", "packSnorm4x8",
		"packUint2x16", "packUint4x16", "packUnorm2x16", "packUnorm4x8", "pow",
		"radians", "reflect", "refract", "round", "roundEven", "sign", "sin", "sinh", "smoothstep", "sqrt", "step",
		"tan", "tanh", "texelFetch", "texelFetchOffset", "texture", "textureGather", "textureGatherOffset", "textureGatherOffsets",
		"textureGrad", "textureGradOffset", "textureLod", "textureLodOffset", "textureOffset", "textureProj", "textureProjGrad",
		"textureProjGradOffset", "textureProjLod", "textureProjLodOffset", "textureProjOffset", "textureQueryLevels", "textureQueryLod", "textureSamples", "textureSize",
		"transpose", "trunc", "uaddCarry", "uint16BitsToFloat16", "uintBitsToFloat", "umulExtended", "unpackDouble2x32", "unpackHalf2x16", "unpackInt2x16", "unpackInt4x16",
		"unpackSnorm2x16", "unpackSnorm4x8", "unpackUint2x16", "unpackUint4x16", "unpackUnorm2x16", "unpackUnorm4x8", "usubBorrow",

		"active", "asm", "atomic_uint", "attribute", "bool", "break", "buffer",
		"bvec2", "bvec3", "bvec4", "case", "cast", "centroid", "class", "coherent", "common", "const", "continue", "default", "discard",
		"dmat2", "dmat2x2", "dmat2x3", "dmat2x4", "dmat3", "dmat3x2", "dmat3x3", "dmat3x4", "dmat4", "dmat4x2", "dmat4x3", "dmat4x4",
		"do", "double", "dvec2", "dvec3", "dvec4", "else", "enum", "extern", "external", "false", "filter", "fixed", "flat", "float",
		"for", "fvec2", "fvec3", "fvec4", "goto", "half", "highp", "hvec2", "hvec3", "hvec4", "if", "iimage1D", "iimage1DArray",
		"iimage2D", "iimage2DArray", "iimage2DMS", "iimage2DMSArray", "iimage2DRect", "iimage3D", "iimageBuffer", "iimageCube",
		"iimageCubeArray", "image1D", "image1DArray", "image2D", "image2DArray", "image2DMS", "image2DMSArray", "image2DRect",
		"image3D", "imageBuffer", "imageCube", "imageCubeArray", "in", "inline", "inout", "input", "int", "interface", "invariant",
		"isampler1D", "isampler1DArray", "isampler2D", "isampler2DArray", "isampler2DMS", "isampler2DMSArray", "isampler2DRect",
		"isampler3D", "isamplerBuffer", "isamplerCube", "isamplerCubeArray", "ivec2", "ivec3", "ivec4", "layout", "long", "lowp",
		"mat2", "mat2x2", "mat2x3", "mat2x4", "mat3", "mat3x2", "mat3x3", "mat3x4", "mat4", "mat4x2", "mat4x3", "mat4x4", "mediump",
		"namespace", "noinline", "noperspective", "out", "output", "packed", "partition", "patch", "precise", "precision", "public", "readonly",
		"resource", "restrict", "return", "sample", "sampler1D", "sampler1DArray", "sampler1DArrayShadow",
		"sampler1DShadow", "sampler2D", "sampler2DArray", "sampler2DArrayShadow", "sampler2DMS", "sampler2DMSArray",
		"sampler2DRect", "sampler2DRectShadow", "sampler2DShadow", "sampler3D", "sampler3DRect", "samplerBuffer",
		"samplerCube", "samplerCubeArray", "samplerCubeArrayShadow", "samplerCubeShadow", "shared", "short", "sizeof", "smooth", "static",
		"struct", "subroutine", "superp", "switch", "template", "this", "true", "typedef", "uimage1D", "uimage1DArray", "uimage2D",
		"uimage2DArray", "uimage2DMS", "uimage2DMSArray", "uimage2DRect", "uimage3D", "uimageBuffer", "uimageCube",
		"uimageCubeArray", "uint", "uniform", "union", "unsigned", "usampler1D", "usampler1DArray", "usampler2D", "usampler2DArray",
		"usampler2DMS", "usampler2DMSArray", "usampler2DRect", "usampler3D", "usamplerBuffer", "usamplerCube",
		"usamplerCubeArray", "using", "uvec2", "uvec3", "uvec4", "varying", "vec2", "vec3", "vec4", "void", "volatile",
		"while", "writeonly",
	};
	// clang-format on

	replace_illegal_names(keywords);
}